

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FxchMan.c
# Opt level: O0

void Fxch_ManComputeLevel(Fxch_Man_t *pFxchMan)

{
  Vec_Int_t *p;
  int iVar1;
  Vec_Int_t *pVVar2;
  int local_24;
  int local_20;
  int iFirst;
  int iVar;
  int i;
  Vec_Int_t *vCube;
  Fxch_Man_t *pFxchMan_local;
  
  local_24 = 0;
  pVVar2 = Vec_WecEntry(pFxchMan->vCubes,0);
  local_20 = Vec_IntEntry(pVVar2,0);
  pVVar2 = Vec_IntStart(pFxchMan->nVars);
  pFxchMan->vLevels = pVVar2;
  for (iFirst = 0; iVar1 = Vec_WecSize(pFxchMan->vCubes), iFirst < iVar1; iFirst = iFirst + 1) {
    pVVar2 = Vec_WecEntry(pFxchMan->vCubes,iFirst);
    iVar1 = Vec_IntEntry(pVVar2,0);
    if (local_20 != iVar1) {
      Vec_IntAddToEntry(pFxchMan->vLevels,local_20,iFirst - local_24);
      local_20 = Vec_IntEntry(pVVar2,0);
      local_24 = iFirst;
    }
    p = pFxchMan->vLevels;
    iVar1 = Fxch_ManComputeLevelCube(pFxchMan,pVVar2);
    Vec_IntUpdateEntry(p,local_20,iVar1);
  }
  return;
}

Assistant:

void Fxch_ManComputeLevel( Fxch_Man_t* pFxchMan )
{
    Vec_Int_t* vCube;
    int i,
        iVar,
        iFirst = 0;

    iVar = Vec_IntEntry( Vec_WecEntry( pFxchMan->vCubes, 0 ), 0 );
    pFxchMan->vLevels = Vec_IntStart( pFxchMan->nVars );

    Vec_WecForEachLevel( pFxchMan->vCubes, vCube, i )
    {
        if ( iVar != Vec_IntEntry( vCube, 0 ) )
        {
            Vec_IntAddToEntry( pFxchMan->vLevels, iVar, i - iFirst );
            iVar = Vec_IntEntry( vCube, 0 );
            iFirst = i;
        }
        Vec_IntUpdateEntry( pFxchMan->vLevels, iVar, Fxch_ManComputeLevelCube( pFxchMan, vCube ) );
    }
}